

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btOverlappingPairCache.cpp
# Opt level: O3

btBroadphasePair * __thiscall
btHashedOverlappingPairCache::internalAddPair
          (btHashedOverlappingPairCache *this,btBroadphaseProxy *proxy0,btBroadphaseProxy *proxy1)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  btOverlappingPairCallback *pbVar4;
  int *piVar5;
  undefined8 uVar6;
  int proxyId1;
  uint uVar7;
  uint uVar8;
  btBroadphasePair *pbVar9;
  int proxyId2;
  long lVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  btBroadphasePair *pbVar16;
  btBroadphaseProxy *pbVar17;
  btBroadphaseProxy *pbVar18;
  
  pbVar17 = proxy1;
  if (proxy1->m_uniqueId < proxy0->m_uniqueId) {
    pbVar17 = proxy0;
    proxy0 = proxy1;
  }
  uVar11 = pbVar17->m_uniqueId << 0x10 | proxy0->m_uniqueId;
  uVar11 = ~(uVar11 << 0xf) + uVar11;
  uVar13 = ((int)uVar11 >> 10 ^ uVar11) * 9;
  uVar13 = (int)uVar13 >> 6 ^ uVar13;
  uVar13 = ~(uVar13 << 0xb) + uVar13;
  uVar13 = (int)uVar13 >> 0x10 ^ uVar13;
  uVar11 = (this->m_overlappingPairArray).m_capacity;
  uVar15 = (ulong)(int)(uVar11 - 1 & uVar13);
  iVar14 = (this->m_hashTable).m_data[uVar15];
  if (iVar14 != -1) {
    pbVar9 = (this->m_overlappingPairArray).m_data;
    do {
      if (((pbVar9[iVar14].m_pProxy0)->m_uniqueId == proxy0->m_uniqueId) &&
         (pbVar16 = pbVar9 + iVar14, pbVar16->m_pProxy1->m_uniqueId == pbVar17->m_uniqueId)) {
        return pbVar16;
      }
      iVar14 = (this->m_next).m_data[iVar14];
    } while (iVar14 != -1);
  }
  uVar3 = (this->m_overlappingPairArray).m_size;
  uVar8 = uVar11;
  uVar7 = uVar3;
  if (uVar3 == uVar11) {
    uVar12 = 1;
    if (uVar11 != 0) {
      uVar12 = uVar11 * 2;
    }
    uVar7 = uVar11;
    if ((int)uVar11 < (int)uVar12) {
      if (uVar12 == 0) {
        pbVar9 = (btBroadphasePair *)0x0;
      }
      else {
        pbVar9 = (btBroadphasePair *)btAlignedAllocInternal((long)(int)uVar12 << 5,0x10);
        uVar7 = (this->m_overlappingPairArray).m_size;
      }
      if (0 < (int)uVar7) {
        lVar10 = 0;
        do {
          pbVar16 = (this->m_overlappingPairArray).m_data;
          puVar1 = (undefined8 *)((long)&pbVar16->m_pProxy0 + lVar10);
          uVar6 = puVar1[1];
          puVar2 = (undefined8 *)((long)&pbVar9->m_pProxy0 + lVar10);
          *puVar2 = *puVar1;
          puVar2[1] = uVar6;
          *(undefined8 *)((long)&pbVar9->m_algorithm + lVar10) =
               *(undefined8 *)((long)&pbVar16->m_algorithm + lVar10);
          *(undefined8 *)((long)&pbVar9->field_3 + lVar10) =
               *(undefined8 *)((long)&pbVar16->field_3 + lVar10);
          lVar10 = lVar10 + 0x20;
        } while ((ulong)uVar7 << 5 != lVar10);
      }
      pbVar16 = (this->m_overlappingPairArray).m_data;
      if ((pbVar16 != (btBroadphasePair *)0x0) &&
         ((this->m_overlappingPairArray).m_ownsMemory == true)) {
        btAlignedFreeInternal(pbVar16);
      }
      (this->m_overlappingPairArray).m_ownsMemory = true;
      (this->m_overlappingPairArray).m_data = pbVar9;
      (this->m_overlappingPairArray).m_capacity = uVar12;
      uVar7 = (this->m_overlappingPairArray).m_size;
      uVar8 = uVar12;
    }
  }
  (this->m_overlappingPairArray).m_size = uVar7 + 1;
  pbVar9 = (this->m_overlappingPairArray).m_data + (int)uVar3;
  pbVar4 = this->m_ghostPairCallback;
  if (pbVar4 != (btOverlappingPairCallback *)0x0) {
    (*pbVar4->_vptr_btOverlappingPairCallback[2])(pbVar4,proxy0,pbVar17);
    uVar8 = (this->m_overlappingPairArray).m_capacity;
  }
  if ((int)uVar11 < (int)uVar8) {
    growTables(this);
    uVar15 = (long)(int)uVar13 & (long)(this->m_overlappingPairArray).m_capacity - 1U;
  }
  pbVar18 = proxy0;
  if (proxy0->m_uniqueId < pbVar17->m_uniqueId) {
    pbVar18 = pbVar17;
    pbVar17 = proxy0;
  }
  pbVar9->m_pProxy0 = pbVar17;
  pbVar9->m_pProxy1 = pbVar18;
  pbVar9->m_algorithm = (btCollisionAlgorithm *)0x0;
  (pbVar9->field_3).m_internalInfo1 = (void *)0x0;
  piVar5 = (this->m_hashTable).m_data;
  (this->m_next).m_data[(int)uVar3] = piVar5[uVar15];
  piVar5[uVar15] = uVar3;
  return pbVar9;
}

Assistant:

btBroadphasePair* btHashedOverlappingPairCache::internalAddPair(btBroadphaseProxy* proxy0, btBroadphaseProxy* proxy1)
{
	if(proxy0->m_uniqueId>proxy1->m_uniqueId) 
		btSwap(proxy0,proxy1);
	int proxyId1 = proxy0->getUid();
	int proxyId2 = proxy1->getUid();

	/*if (proxyId1 > proxyId2) 
		btSwap(proxyId1, proxyId2);*/

	int	hash = static_cast<int>(getHash(static_cast<unsigned int>(proxyId1),static_cast<unsigned int>(proxyId2)) & (m_overlappingPairArray.capacity()-1));	// New hash value with new mask


	btBroadphasePair* pair = internalFindPair(proxy0, proxy1, hash);
	if (pair != NULL)
	{
		return pair;
	}
	/*for(int i=0;i<m_overlappingPairArray.size();++i)
		{
		if(	(m_overlappingPairArray[i].m_pProxy0==proxy0)&&
			(m_overlappingPairArray[i].m_pProxy1==proxy1))
			{
			printf("Adding duplicated %u<>%u\r\n",proxyId1,proxyId2);
			internalFindPair(proxy0, proxy1, hash);
			}
		}*/
	int count = m_overlappingPairArray.size();
	int oldCapacity = m_overlappingPairArray.capacity();
	void* mem = &m_overlappingPairArray.expandNonInitializing();

	//this is where we add an actual pair, so also call the 'ghost'
	if (m_ghostPairCallback)
		m_ghostPairCallback->addOverlappingPair(proxy0,proxy1);

	int newCapacity = m_overlappingPairArray.capacity();

	if (oldCapacity < newCapacity)
	{
		growTables();
		//hash with new capacity
		hash = static_cast<int>(getHash(static_cast<unsigned int>(proxyId1),static_cast<unsigned int>(proxyId2)) & (m_overlappingPairArray.capacity()-1));
	}
	
	pair = new (mem) btBroadphasePair(*proxy0,*proxy1);
//	pair->m_pProxy0 = proxy0;
//	pair->m_pProxy1 = proxy1;
	pair->m_algorithm = 0;
	pair->m_internalTmpValue = 0;
	

	m_next[count] = m_hashTable[hash];
	m_hashTable[hash] = count;

	return pair;
}